

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libbrain.h
# Opt level: O0

int libbrain::
    state<5U,_(libbrain::bfop)4,_(libbrain::bfop)6,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)8,_(libbrain::bfop)9>
    ::exec(uchar *data,uint data_ptr,FILE *output,FILE *input)

{
  int iVar1;
  FILE *in_RCX;
  FILE *in_RDX;
  uint in_ESI;
  long in_RDI;
  FILE *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  fputc((uint)*(byte *)(in_RDI + (ulong)in_ESI),in_RDX);
  iVar1 = state<6U,_(libbrain::bfop)5,_(libbrain::bfop)6,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)8,_(libbrain::bfop)9>
          ::exec((uchar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDX >> 0x20),
                 in_RCX,in_stack_ffffffffffffffd8);
  return iVar1;
}

Assistant:

static constexpr inline int exec(unsigned char data[], unsigned int data_ptr, FILE* output, FILE* input) {
            #ifdef LIBBRAIN_BUILD_WITH_DEBUG

            fprintf(stderr, "OUT instruction reached at %i, data_ptr = %i\n", ins_ptr, data_ptr);

            #endif

            fputc(data[data_ptr], output);
            return state<ins_ptr + 1, op_at<ins_ptr + 1, op, ops...>::operation, op, ops...>
                    ::exec(data, data_ptr, output, input);
        }